

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_secret.cpp
# Opt level: O2

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformSecret(Transformer *this,PGCreateSecretStmt *stmt)

{
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var1;
  _Head_base<0UL,_duckdb::CreateSecretInfo_*,_false> _Var2;
  pointer pCVar3;
  type info;
  type expr;
  pointer pCVar4;
  ParserException *this_00;
  InvalidInputException *this_01;
  long in_RDX;
  pointer *__ptr;
  Transformer *this_02;
  _Head_base<0UL,_duckdb::CreateSecretInfo_*,_false> local_d8;
  allocator local_c9;
  string local_c8;
  string local_a8;
  Value value;
  string local_48;
  
  this_02 = this;
  make_uniq<duckdb::CreateStatement>();
  local_a8._M_dataplus._M_p._0_1_ =
       TransformOnConflict(this_02,*(PGOnCreateConflict *)(in_RDX + 0x30));
  ::std::__cxx11::string::string((string *)&local_c8,*(char **)(in_RDX + 8),&local_c9);
  StringUtil::Upper((string *)&value,&local_c8);
  local_48._M_dataplus._M_p._0_1_ =
       EnumUtil::FromString<duckdb::SecretPersistType>((char *)value.type_._0_8_);
  make_uniq<duckdb::CreateSecretInfo,duckdb::OnCreateConflict,duckdb::SecretPersistType>
            ((duckdb *)&local_d8,(OnCreateConflict *)&local_a8,(SecretPersistType *)&local_48);
  ::std::__cxx11::string::~string((string *)&value);
  ::std::__cxx11::string::~string((string *)&local_c8);
  if (*(char **)(in_RDX + 0x10) != (char *)0x0) {
    ::std::__cxx11::string::string
              ((string *)&local_c8,*(char **)(in_RDX + 0x10),(allocator *)&local_a8);
    StringUtil::Lower((string *)&value,&local_c8);
    pCVar3 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                           *)&local_d8);
    ::std::__cxx11::string::operator=((string *)&pCVar3->name,(string *)&value);
    ::std::__cxx11::string::~string((string *)&value);
    ::std::__cxx11::string::~string((string *)&local_c8);
  }
  if (*(char **)(in_RDX + 0x18) != (char *)0x0) {
    ::std::__cxx11::string::string
              ((string *)&local_c8,*(char **)(in_RDX + 0x18),(allocator *)&local_a8);
    StringUtil::Lower((string *)&value,&local_c8);
    pCVar3 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                           *)&local_d8);
    ::std::__cxx11::string::operator=((string *)&pCVar3->storage_type,(string *)&value);
    ::std::__cxx11::string::~string((string *)&value);
    ::std::__cxx11::string::~string((string *)&local_c8);
  }
  if (*(long *)(in_RDX + 0x28) != 0) {
    info = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
           ::operator*((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                        *)&local_d8);
    TransformCreateSecretOptions((Transformer *)stmt,info,*(PGList **)(in_RDX + 0x28));
  }
  pCVar3 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                         *)&local_d8);
  if ((pCVar3->type).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pCVar3 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                           *)&local_d8);
    if ((pCVar3->name)._M_string_length == 0) {
      pCVar3 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                             *)&local_d8);
      expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(&pCVar3->type);
      GetConstantExpressionValue(&value,expr);
      if (value.is_null == true) {
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_c8,
                   "Can not combine a non-constant expression for the secret type with a default-named secret. Either provide an explicit secret name or use a constant expression for the secret type."
                   ,(allocator *)&local_a8);
        InvalidInputException::InvalidInputException(this_01,&local_c8);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Value::ToString_abi_cxx11_(&local_48,&value);
      StringUtil::Lower(&local_a8,&local_48);
      ::std::operator+(&local_c8,"__default_",&local_a8);
      pCVar3 = unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateSecretInfo,_std::default_delete<duckdb::CreateSecretInfo>,_true>
                             *)&local_d8);
      ::std::__cxx11::string::operator=((string *)&pCVar3->name,(string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::__cxx11::string::~string((string *)&local_48);
      Value::~Value(&value);
    }
    _Var2._M_head_impl = local_d8._M_head_impl;
    local_d8._M_head_impl = (CreateSecretInfo *)0x0;
    pCVar4 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
             ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                           *)this);
    _Var1._M_head_impl =
         (pCVar4->info).
         super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (pCVar4->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
    _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
         &(_Var2._M_head_impl)->super_CreateInfo;
    if (_Var1._M_head_impl != (CreateInfo *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ParseInfo + 8))();
    }
    if (local_d8._M_head_impl != (CreateSecretInfo *)0x0) {
      (*((local_d8._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
           (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)this;
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&value,"Failed to create secret - secret must have a type defined",
             (allocator *)&local_c8);
  ParserException::ParserException(this_00,(string *)&value);
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformSecret(duckdb_libpgquery::PGCreateSecretStmt &stmt) {
	auto result = make_uniq<CreateStatement>();

	auto create_secret_info =
	    make_uniq<CreateSecretInfo>(TransformOnConflict(stmt.onconflict),
	                                EnumUtil::FromString<SecretPersistType>(StringUtil::Upper(stmt.persist_type)));

	if (stmt.secret_name) {
		create_secret_info->name = StringUtil::Lower(stmt.secret_name);
	}

	if (stmt.secret_storage) {
		create_secret_info->storage_type = StringUtil::Lower(stmt.secret_storage);
	}

	if (stmt.options) {
		TransformCreateSecretOptions(*create_secret_info, stmt.options);
	}

	if (!create_secret_info->type) {
		throw ParserException("Failed to create secret - secret must have a type defined");
	}
	if (create_secret_info->name.empty()) {
		auto value = GetConstantExpressionValue(*create_secret_info->type);
		if (value.IsNull()) {
			throw InvalidInputException(
			    "Can not combine a non-constant expression for the secret type with a default-named secret. Either "
			    "provide an explicit secret name or use a constant expression for the secret type.");
		}
		create_secret_info->name = "__default_" + StringUtil::Lower(value.ToString());
	}

	result->info = std::move(create_secret_info);

	return result;
}